

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

void ApplyInverseTransforms(VP8LDecoder *dec,int start_row,int num_rows,uint32_t *rows)

{
  int iVar1;
  uint32_t *out;
  VP8LTransform *transform;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)dec->next_transform;
  iVar1 = dec->width;
  out = dec->argb_cache;
  transform = dec->transforms + (uVar2 - 1);
  for (; 0 < (int)uVar2; uVar2 = (ulong)((int)uVar2 - 1)) {
    VP8LInverseTransform(transform,start_row,num_rows + start_row,rows,out);
    transform = transform + -1;
    rows = out;
  }
  if (rows != out) {
    memcpy(out,rows,(long)iVar1 * (long)num_rows * 4);
    return;
  }
  return;
}

Assistant:

static void ApplyInverseTransforms(VP8LDecoder* const dec,
                                   int start_row, int num_rows,
                                   const uint32_t* const rows) {
  int n = dec->next_transform;
  const int cache_pixs = dec->width * num_rows;
  const int end_row = start_row + num_rows;
  const uint32_t* rows_in = rows;
  uint32_t* const rows_out = dec->argb_cache;

  // Inverse transforms.
  while (n-- > 0) {
    VP8LTransform* const transform = &dec->transforms[n];
    VP8LInverseTransform(transform, start_row, end_row, rows_in, rows_out);
    rows_in = rows_out;
  }
  if (rows_in != rows_out) {
    // No transform called, hence just copy.
    memcpy(rows_out, rows_in, cache_pixs * sizeof(*rows_out));
  }
}